

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThriftSenderTest.cpp
# Opt level: O2

void __thiscall
jaegertracing::ThriftSender_testManyMessages_Test::~ThriftSender_testManyMessages_Test
          (ThriftSender_testManyMessages_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ThriftSender, testManyMessages)
{
    const auto handle = testutils::TracerUtil::installGlobalTracer();
    const auto tracer =
        std::static_pointer_cast<const Tracer>(opentracing::Tracer::Global());

    std::unique_ptr<utils::Transport> transporter(
        new utils::UDPTransporter(handle->_mockAgent->spanServerAddress(), 0));
    ThriftSender sender(
        std::forward<std::unique_ptr<utils::Transport>>(transporter));
    constexpr auto kNumMessages = 2000;
    const auto logger = logging::consoleLogger();
    for (auto i = 0; i < kNumMessages; ++i) {
        Span span(tracer);
        span.SetOperationName("test" + std::to_string(i));
        ASSERT_NO_THROW(sender.append(span));
    }
}